

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFNameTreeObjectHelper.cc
# Opt level: O0

bool __thiscall
QPDFNameTreeObjectHelper::findObject
          (QPDFNameTreeObjectHelper *this,string *name,QPDFObjectHandle *oh)

{
  bool bVar1;
  pointer pTVar2;
  iterator local_b8;
  undefined1 local_70 [8];
  iterator i;
  QPDFObjectHandle *oh_local;
  string *name_local;
  QPDFNameTreeObjectHelper *this_local;
  
  i.ivalue.second.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)oh;
  find((iterator *)local_70,this,name,false);
  end(&local_b8,this);
  bVar1 = iterator::operator==((iterator *)local_70,&local_b8);
  iterator::~iterator(&local_b8);
  if (!bVar1) {
    pTVar2 = iterator::operator->[abi_cxx11_((iterator *)local_70);
    QPDFObjectHandle::operator=
              ((QPDFObjectHandle *)
               i.ivalue.second.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
               &pTVar2->second);
  }
  this_local._7_1_ = !bVar1;
  iterator::~iterator((iterator *)local_70);
  return this_local._7_1_;
}

Assistant:

bool
QPDFNameTreeObjectHelper::findObject(std::string const& name, QPDFObjectHandle& oh)
{
    auto i = find(name);
    if (i == end()) {
        return false;
    }
    oh = i->second;
    return true;
}